

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

xmlChar * xmlParseNameAndCompare(xmlParserCtxtPtr ctxt,xmlChar *other)

{
  byte bVar1;
  xmlParserInputPtr pxVar2;
  xmlChar *pxVar3;
  xmlChar *pxVar4;
  long lVar5;
  
  pxVar2 = ctxt->input;
  if (((pxVar2->flags & 0x40) == 0) && ((long)pxVar2->end - (long)pxVar2->cur < 0xfa)) {
    xmlParserGrow(ctxt);
    pxVar2 = ctxt->input;
  }
  lVar5 = 0;
  while( true ) {
    bVar1 = pxVar2->cur[lVar5];
    if ((bVar1 == 0) || (bVar1 != other[lVar5])) break;
    lVar5 = lVar5 + 1;
  }
  if ((other[lVar5] == 0) &&
     ((bVar1 < 0x3f && ((0x4000000100002600U >> ((ulong)(uint)bVar1 & 0x3f) & 1) != 0)))) {
    pxVar2->col = pxVar2->col + (int)lVar5;
    pxVar2->cur = pxVar2->cur + lVar5;
    pxVar4 = (xmlChar *)0x1;
  }
  else {
    pxVar3 = xmlParseName(ctxt);
    pxVar4 = (xmlChar *)0x1;
    if (pxVar3 != other) {
      pxVar4 = pxVar3;
    }
  }
  return pxVar4;
}

Assistant:

static const xmlChar *
xmlParseNameAndCompare(xmlParserCtxtPtr ctxt, xmlChar const *other) {
    register const xmlChar *cmp = other;
    register const xmlChar *in;
    const xmlChar *ret;

    GROW;

    in = ctxt->input->cur;
    while (*in != 0 && *in == *cmp) {
	++in;
	++cmp;
    }
    if (*cmp == 0 && (*in == '>' || IS_BLANK_CH (*in))) {
	/* success */
	ctxt->input->col += in - ctxt->input->cur;
	ctxt->input->cur = in;
	return (const xmlChar*) 1;
    }
    /* failure (or end of input buffer), check with full function */
    ret = xmlParseName (ctxt);
    /* strings coming from the dictionary direct compare possible */
    if (ret == other) {
	return (const xmlChar*) 1;
    }
    return ret;
}